

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_brent.c
# Opt level: O1

double xc_math_brent(xc_brent_f *f,double lower_bound,double upper_bound,double TOL,double MAX_ITER,
                    void *f_params)

{
  bool bVar1;
  uint uVar2;
  double *in_RCX;
  double *extraout_RDX;
  int iVar3;
  double *pdVar4;
  void *pvVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  
  local_98._8_8_ = in_XMM1_Qb;
  local_98._0_8_ = upper_bound;
  local_88._8_8_ = in_XMM0_Qb;
  local_88._0_8_ = lower_bound;
  pdVar4 = (double *)f_params;
  dVar7 = (*f)(lower_bound,f_params);
  pvVar5 = f_params;
  dVar8 = (*f)(upper_bound,f_params);
  iVar3 = (int)pvVar5;
  if (0.0 < dVar7 * dVar8) {
    xc_math_brent_cold_1();
    dVar8 = *pdVar4;
    if (iVar3 == 1) {
      dVar7 = 0.0;
      if (0.0 <= dVar8) {
        dVar7 = dVar8;
      }
      *extraout_RDX = dVar7;
      dVar7 = 0.0;
    }
    else {
      dVar8 = dVar8 + pdVar4[1];
      *extraout_RDX = dVar8;
      if (dVar8 <= 0.0) {
        *extraout_RDX = 0.0;
        dVar7 = 0.0;
      }
      else {
        dVar10 = (*pdVar4 - pdVar4[1]) / dVar8;
        if (1.0 <= dVar10) {
          dVar10 = 1.0;
        }
        dVar7 = -1.0;
        if (-1.0 <= dVar10) {
          dVar7 = dVar10;
        }
      }
    }
    *in_RCX = dVar7;
    return dVar8;
  }
  uVar6 = -(ulong)(ABS(dVar7) < ABS(dVar8));
  dVar13 = (double)(~uVar6 & (ulong)lower_bound | uVar6 & (ulong)upper_bound);
  auVar17 = local_88;
  dVar10 = dVar7;
  if (ABS(dVar8) <= ABS(dVar7)) {
    auVar17 = local_98;
    dVar10 = dVar8;
    dVar8 = dVar7;
  }
  if (MAX_ITER <= 1.0) {
    local_88._0_8_ = auVar17._0_8_;
    local_98._0_8_ = dVar13;
  }
  else {
    auVar14._8_8_ = dVar8;
    auVar14._0_8_ = dVar13;
    bVar1 = true;
    iVar3 = 2;
    dVar7 = 0.0;
    do {
      dVar18 = dVar10;
      local_88._0_8_ = auVar17._0_8_;
      local_98._0_8_ = auVar14._0_8_;
      if (ABS((double)local_88._0_8_ - (double)local_98._0_8_) < TOL) goto LAB_00f11811;
      dVar10 = auVar14._8_8_;
      if ((dVar10 != dVar8) || (NAN(dVar10) || NAN(dVar8))) {
        if ((dVar18 == dVar8) && (!NAN(dVar18) && !NAN(dVar8))) goto LAB_00f115b8;
        auVar17._0_8_ = (dVar10 - dVar8) * (dVar10 - dVar18);
        auVar17._8_8_ = (dVar8 - dVar18) * (dVar8 - dVar10);
        auVar12._0_8_ = dVar18 * (double)local_98._0_8_ * dVar8;
        auVar12._8_8_ = dVar13 * dVar10 * dVar18;
        auVar17 = divpd(auVar12,auVar17);
        dVar8 = auVar17._8_8_ +
                ((double)local_88._0_8_ * dVar10 * dVar8) / ((dVar18 - dVar8) * (dVar18 - dVar10)) +
                auVar17._0_8_;
      }
      else {
LAB_00f115b8:
        dVar8 = (double)local_88._0_8_ -
                (((double)local_88._0_8_ - (double)local_98._0_8_) * dVar18) / (dVar18 - dVar10);
      }
      if ((dVar8 < ((double)local_98._0_8_ * 3.0 + (double)local_88._0_8_) * 0.25) ||
         ((double)local_88._0_8_ < dVar8)) {
LAB_00f116ad:
        dVar8 = ((double)local_98._0_8_ + (double)local_88._0_8_) * 0.5;
        bVar1 = true;
      }
      else {
        if (bVar1) {
          if (ABS(dVar8 - (double)local_88._0_8_) < ABS((double)local_88._0_8_ - dVar13) * 0.5) {
LAB_00f1166e:
            if (TOL <= ABS((double)local_88._0_8_ - dVar13)) {
              if (!bVar1) goto LAB_00f11690;
              goto LAB_00f117c6;
            }
          }
          goto LAB_00f116ad;
        }
        if (ABS(dVar13 - dVar7) * 0.5 <= ABS(dVar8 - (double)local_88._0_8_)) goto LAB_00f116ad;
        if (bVar1) goto LAB_00f1166e;
LAB_00f11690:
        if (ABS(dVar13 - dVar7) < TOL) goto LAB_00f116ad;
LAB_00f117c6:
        bVar1 = false;
      }
      dVar7 = (*f)(dVar8,f_params);
      uVar2 = (uint)(dVar10 * dVar7 < 0.0);
      auVar15._0_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
      auVar15._4_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
      auVar15._8_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
      auVar15._12_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
      auVar11._8_8_ = dVar7;
      auVar11._0_8_ = dVar8;
      auVar12 = auVar14 & auVar15 | ~auVar15 & auVar11;
      auVar16._8_8_ = dVar18;
      auVar16._0_8_ = local_88._0_8_;
      auVar16 = ~auVar15 & auVar16 | auVar11 & auVar15;
      dVar8 = ABS(auVar12._8_8_);
      dVar7 = ABS(auVar16._8_8_);
      auVar17 = auVar12;
      if (dVar7 <= dVar8) {
        auVar17 = auVar16;
      }
      auVar14 = auVar16;
      if (dVar7 <= dVar8) {
        auVar14 = auVar12;
      }
      local_98._0_8_ = auVar14._0_8_;
      dVar9 = (double)iVar3;
      iVar3 = iVar3 + 1;
      dVar10 = (double)(~-(ulong)(dVar8 < dVar7) & (ulong)auVar16._8_8_ |
                       (ulong)auVar12._8_8_ & -(ulong)(dVar8 < dVar7));
      dVar8 = dVar18;
      dVar7 = dVar13;
      dVar13 = (double)local_88._0_8_;
      local_88._0_8_ = auVar17._0_8_;
    } while (dVar9 < MAX_ITER);
  }
  fwrite("Warning: Convergence not reached in brent\n",0x2a,1,_stderr);
LAB_00f11811:
  return ((double)local_98._0_8_ + (double)local_88._0_8_) * 0.5;
}

Assistant:

GPU_FUNCTION
double xc_math_brent
(xc_brent_f f,
 double lower_bound, double upper_bound,
 double TOL, double MAX_ITER,
 void *f_params)
{
  double a, b, fa, fb, fs;
  double tmp;
  double c, fc, s, d;
  int mflag, iter;

  a = lower_bound;
  b = upper_bound;
  fa = f(a, f_params);
  fb = f(b, f_params);
  fs = 0;

  if (fa * fb > 0){
#ifndef HAVE_CUDA
    fprintf(stderr, "Brent: bracketing error [%lf,%lf]\n", a, b);
    exit(1);
#endif
  }

  if (fabs(fa) < fabs(fb)){
    tmp = a;   a =  b;  b = tmp; /* swap  a and  b */
    tmp = fa; fa = fb; fb = tmp; /* swap fa and fb */
  }

  c = a;     /* c now equals the largest magnitude of the lower and upper bounds */
  fc = fa;   /* precompute function evalutation for point c by assigning it the same value as fa */
  mflag = 1; /* boolean flag used to evaluate if statement later on */
  s = 0;     /* Our root that will be returned */
  d = 0;     /* Only used if mflag is unset (mflag == false) */

  for (iter=1; iter<MAX_ITER; ++iter){
    /* stop if converged or error is less than tolerance */
    if (fabs(b - a) < TOL)
      return (b + a)/2.0;

    if (fa != fc && fb != fc){
      /* use inverse quadratic interopolation */
      s = ( a * fb * fc / ((fa - fb) * (fa - fc)) )
        + ( b * fa * fc / ((fb - fa) * (fb - fc)) )
        + ( c * fa * fb / ((fc - fa) * (fc - fb)) );
    }else{
      /* secant method */
      s = b - fb * (b - a) / (fb - fa);
    }

    /*
      (condition 1) s is not between  (3a+b)/4  and b or
      (condition 2) (mflag is true and |s−b| ≥ |b−c|/2) or
      (condition 3) (mflag is false and |s−b| ≥ |c−d|/2) or
      (condition 4) (mflag is set and |b−c| < |TOL|) or
      (condition 5) (mflag is false and |c−d| < |TOL|)
        */
    if(((s < (3 * a + b) * 0.25) || (s > b) ) ||
       (  mflag && (fabs(s-b) >= (fabs(b-c) * 0.5))) ||
       ( !mflag && (fabs(s-b) >= (fabs(c-d) * 0.5))) ||
       (  mflag && (fabs(b-c) < TOL)) ||
       ( !mflag && (fabs(c-d) < TOL))){
      /* bisection */
      s = (a+b)*0.5;
      mflag = 1;
    }else
      mflag = 0;

    fs = f(s, f_params);
    d = c;
    c = b;
    fc = fb;

    if (fa*fs < 0){
      b = s;
      fb = fs;
    }else{
      a = s;
      fa = fs;
    }

    if (fabs(fa) < fabs(fb)){
      tmp = a;   a =  b;  b = tmp; /* swap  a and  b */
      tmp = fa; fa = fb; fb = tmp; /* swap fa and fb */
    }

  }

#ifndef HAVE_CUDA
  fprintf(stderr, "Warning: Convergence not reached in brent\n");
#endif

  return (b + a)/2.0;

}